

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O2

bool __thiscall RTIMUBMX055::IMURead(RTIMUBMX055 *this)

{
  bool bVar1;
  uint64_t uVar2;
  uchar status;
  uchar accelData [6];
  uchar gyroData [6];
  float mz;
  float my;
  float mx;
  uchar magData [8];
  
  bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr,
                            '\x0e','\x01',&status,"Failed to read BMX055 gyro fifo status");
  if (bVar1) {
    if ((char)status < '\0') {
      fwrite("BMX055 fifo overflow\n",0x15,1,_stderr);
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_gyroSlaveAddr,'>','@',"Failed to set BMX055 FIFO config");
      if (bVar1) {
        uVar2 = RTMath::currentUSecsSinceEpoch();
        (this->super_RTIMU).m_imuData.timestamp = uVar2;
      }
    }
    else if ((((status != '\0') &&
              (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                         this->m_gyroSlaveAddr,'?','\x06',gyroData,
                                         "Failed to read BMX055 gyro data"), bVar1)) &&
             (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                        this->m_accelSlaveAddr,'\x02','\x06',accelData,
                                        "Failed to read BMX055 accel data"), bVar1)) &&
            (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_magSlaveAddr,'B','\b',magData,
                                       "Failed to read BMX055 mag data"), bVar1)) {
      RTMath::convertToVector(gyroData,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,false);
      accelData[0] = accelData[0] & 0xf0;
      accelData[2] = accelData[2] & 0xf0;
      accelData[4] = accelData[4] & 0xf0;
      RTMath::convertToVector
                (accelData,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,false);
      processMagData(this,magData,&mx,&my,&mz);
      *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) =
           *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) ^ 0x8000000080000000;
      (this->super_RTIMU).m_imuData.accel.m_data[0] = -(this->super_RTIMU).m_imuData.accel.m_data[0]
      ;
      *(ulong *)(this->super_RTIMU).m_imuData.compass.m_data = CONCAT44(mx,my) ^ 0x8000000080000000;
      (this->super_RTIMU).m_imuData.compass.m_data[2] = -mz;
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      if (this->m_firstTime == true) {
        uVar2 = RTMath::currentUSecsSinceEpoch();
      }
      else {
        uVar2 = (this->super_RTIMU).m_imuData.timestamp + (this->super_RTIMU).m_sampleInterval;
      }
      (this->super_RTIMU).m_imuData.timestamp = uVar2;
      this->m_firstTime = false;
      RTIMU::updateFusion(&this->super_RTIMU);
      return true;
    }
  }
  return false;
}

Assistant:

bool RTIMUBMX055::IMURead()
{
    unsigned char status;
    unsigned char gyroData[6];
    unsigned char accelData[6];
    unsigned char magData[8];

    if (!m_settings->HALRead(m_gyroSlaveAddr, BMX055_GYRO_FIFO_STATUS, 1, &status, "Failed to read BMX055 gyro fifo status"))
        return false;

    if (status & 0x80) {
        // fifo overflowed
        HAL_ERROR("BMX055 fifo overflow\n");

        // this should clear it
        if (!m_settings->HALWrite(m_gyroSlaveAddr, BMX055_GYRO_FIFO_CONFIG_1, 0x40, "Failed to set BMX055 FIFO config"))
            return false;

        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();  // try to fix timestamp
        return false;
    }

    if (status == 0)
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, BMX055_GYRO_FIFO_DATA, 6, gyroData, "Failed to read BMX055 gyro data"))
            return false;

    if (!m_settings->HALRead(m_accelSlaveAddr, BMX055_ACCEL_X_LSB, 6, accelData, "Failed to read BMX055 accel data"))
        return false;

    if (!m_settings->HALRead(m_magSlaveAddr, BMX055_MAG_X_LSB, 8, magData, "Failed to read BMX055 mag data"))
        return false;

    RTMath::convertToVector(gyroData, m_imuData.gyro, m_gyroScale, false);

    //  need to prepare accel data

    accelData[0] &= 0xf0;
    accelData[2] &= 0xf0;
    accelData[4] &= 0xf0;

    RTMath::convertToVector(accelData, m_imuData.accel, m_accelScale, false);

    float mx, my, mz;

    processMagData(magData, mx, my, mz);
    m_imuData.compass.setX(mx);
    m_imuData.compass.setY(my);
    m_imuData.compass.setZ(mz);

    //  sort out gyro axes

    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel axes

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  sort out mag axes

#ifdef BMX055_REMAP
    m_imuData.compass.setY(-m_imuData.compass.y());
    m_imuData.compass.setZ(-m_imuData.compass.z());
#else
    RTFLOAT temp =  m_imuData.compass.x();
    m_imuData.compass.setX(-m_imuData.compass.y());
    m_imuData.compass.setY(-temp);
    m_imuData.compass.setZ(-m_imuData.compass.z());
#endif
    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    if (m_firstTime)
        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    else
        m_imuData.timestamp += m_sampleInterval;

    m_firstTime = false;

    //  now update the filter

    updateFusion();

    return true;
}